

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::basic_parser_impl::printOptionInfo(basic_parser_impl *this,Option *O,size_t GlobalWidth)

{
  uint uVar1;
  Option *this_00;
  int iVar2;
  raw_ostream *prVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  void *__buf;
  size_t extraout_RDX_00;
  size_t sVar5;
  size_t sVar6;
  size_t in_R8;
  size_t sVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef HelpStr;
  char *pcVar4;
  
  prVar3 = outs();
  Str.Length = 3;
  Str.Data = "  -";
  prVar3 = raw_ostream::operator<<(prVar3,Str);
  raw_ostream::operator<<(prVar3,O->ArgStr);
  iVar2 = (**this->_vptr_basic_parser_impl)(this);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
  if (extraout_RDX != 0) {
    uVar1 = *(uint *)&O->field_0xc;
    prVar3 = outs();
    if ((uVar1 >> 10 & 1) == 0) {
      Str_00.Length = 2;
      Str_00.Data = "=<";
      prVar3 = raw_ostream::operator<<(prVar3,Str_00);
      sVar6 = (O->ValueStr).Length;
      sVar7 = extraout_RDX;
      if (sVar6 != 0) {
        pcVar4 = (O->ValueStr).Data;
        sVar7 = sVar6;
      }
      Str_01.Length = sVar7;
      Str_01.Data = pcVar4;
      prVar3 = raw_ostream::operator<<(prVar3,Str_01);
      pcVar4 = prVar3->OutBufCur;
      if (pcVar4 < prVar3->OutBufEnd) {
        prVar3->OutBufCur = pcVar4 + 1;
        *pcVar4 = '>';
      }
      else {
        raw_ostream::write(prVar3,0x3e,__buf,(size_t)pcVar4);
      }
    }
    else {
      Str_02.Length = 2;
      Str_02.Data = " <";
      prVar3 = raw_ostream::operator<<(prVar3,Str_02);
      sVar6 = (O->ValueStr).Length;
      sVar7 = extraout_RDX;
      if (sVar6 != 0) {
        pcVar4 = (O->ValueStr).Data;
        sVar7 = sVar6;
      }
      Str_03.Length = sVar7;
      Str_03.Data = pcVar4;
      prVar3 = raw_ostream::operator<<(prVar3,Str_03);
      Str_04.Length = 4;
      Str_04.Data = ">...";
      raw_ostream::operator<<(prVar3,Str_04);
    }
  }
  sVar6 = (O->ArgStr).Length;
  this_00 = (Option *)(O->HelpStr).Data;
  pcVar4 = (char *)(O->HelpStr).Length;
  (**this->_vptr_basic_parser_impl)(this);
  if (extraout_RDX_00 != 0) {
    sVar7 = (O->ValueStr).Length;
    sVar5 = extraout_RDX_00;
    if (sVar7 != 0) {
      sVar5 = sVar7;
    }
    sVar6 = sVar5 + (ulong)((O->field_0xd & 4) >> 2) * 3 + sVar6 + 3;
  }
  HelpStr.Length = GlobalWidth;
  HelpStr.Data = pcVar4;
  Option::printHelpStr(this_00,HelpStr,sVar6 + 6,in_R8);
  return;
}

Assistant:

void basic_parser_impl::printOptionInfo(const Option &O,
                                        size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;

  auto ValName = getValueName();
  if (!ValName.empty()) {
    if (O.getMiscFlags() & PositionalEatsArgs) {
      outs() << " <" << getValueStr(O, ValName) << ">...";
    } else {
      outs() << "=<" << getValueStr(O, ValName) << '>';
    }
  }

  Option::printHelpStr(O.HelpStr, GlobalWidth, getOptionWidth(O));
}